

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

char * load_program(void)

{
  FILE *__stream;
  size_t __n;
  char *__ptr;
  
  __stream = fopen("tests/test.ch","rb");
  __ptr = (char *)0x0;
  fseek(__stream,0,2);
  __n = ftell(__stream);
  fseek(__stream,0,0);
  if (__n != 0xffffffffffffffff) {
    __ptr = (char *)malloc(__n + 1);
    fread(__ptr,1,__n,__stream);
    fclose(__stream);
    __ptr[__n] = '\0';
  }
  return __ptr;
}

Assistant:

char *load_program() {
  FILE *file = fopen("tests/test.ch", "rb");
  fseek(file, 0, SEEK_END);
  long size = ftell(file);
  fseek(file, 0, SEEK_SET);

  if (size == -1) {
    return NULL;
  }

  char *program = malloc(size + 1);
  fread(program, 1, size, file);
  fclose(file);

  program[size] = 0;

  return program;
}